

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O1

string * __thiscall test_app::str_abi_cxx11_(string *__return_storage_ptr__,test_app *this)

{
  long lVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  cppcms::application::response();
  cppcms::http::response::out();
  std::ostream::flush();
  lVar1 = std::__cxx11::string::find((char *)&this->output_,0x11549d,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)&this->output_);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string str()
	{
		response().out() << std::flush;
		size_t pos = output_.find("\r\n\r\n");
		std::string result;
		if(pos != std::string::npos) {
			result = output_.substr(pos+4);
		}
		else {
			result = output_;
		}
		output_.clear();
		return result;
	}